

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtree.c
# Opt level: O0

void do_send_receive(node_info *my_info,int tile_held,IceTInt num_tiles,
                    IceTBoolean *all_contained_tmasks,IceTImage image,IceTVoid *inSparseImageBuffer,
                    IceTSizeType inSparseImageBufferSize,IceTSparseImage outSparseImage)

{
  IceTSizeType local_4c;
  void *pvStack_48;
  IceTSizeType package_size;
  IceTVoid *package_buffer;
  IceTSparseImage inSparseImage;
  IceTVoid *inSparseImageBuffer_local;
  IceTBoolean *all_contained_tmasks_local;
  IceTInt num_tiles_local;
  int tile_held_local;
  node_info *my_info_local;
  IceTSparseImage outSparseImage_local;
  IceTImage image_local;
  
  inSparseImage.opaque_internals = inSparseImageBuffer;
  all_contained_tmasks_local._4_4_ = tile_held;
  if (my_info->tile_sending != -1) {
    if (tile_held == my_info->tile_sending) {
      icetCompressImage(image,outSparseImage);
      all_contained_tmasks_local._4_4_ = -1;
    }
    else {
      icetGetCompressedTileImage(my_info->tile_sending,outSparseImage);
    }
    icetSparseImagePackageForSend(outSparseImage,&stack0xffffffffffffffb8,&local_4c);
  }
  if (my_info->tile_receiving == -1) {
    if (my_info->tile_sending != -1) {
      icetCommSend(pvStack_48,local_4c,0x8001,my_info->send_dest,0x28);
    }
  }
  else {
    if ((all_contained_tmasks_local._4_4_ != my_info->tile_receiving) &&
       (all_contained_tmasks[my_info->rank * num_tiles + my_info->tile_receiving] != '\0')) {
      icetGetTileImage(my_info->tile_receiving,image);
      all_contained_tmasks_local._4_4_ = my_info->tile_receiving;
    }
    if (my_info->tile_sending == -1) {
      icetCommRecv(inSparseImage.opaque_internals,inSparseImageBufferSize,0x8001,my_info->recv_src,
                   0x28);
    }
    else {
      icetCommSendrecv(pvStack_48,local_4c,0x8001,my_info->send_dest,0x28,
                       inSparseImage.opaque_internals,inSparseImageBufferSize,0x8001,
                       my_info->recv_src,0x28);
    }
    package_buffer = (IceTVoid *)icetSparseImageUnpackageFromReceive(inSparseImage.opaque_internals)
    ;
    if (all_contained_tmasks_local._4_4_ == my_info->tile_receiving) {
      icetCompressedComposite(image,(IceTSparseImage)package_buffer,1);
    }
    else {
      icetDecompressImage((IceTSparseImage)package_buffer,image);
    }
  }
  return;
}

Assistant:

static void do_send_receive(const struct node_info *my_info, int tile_held,
                            IceTInt num_tiles,
                            IceTBoolean *all_contained_tmasks,
                            IceTImage image,
                            IceTVoid *inSparseImageBuffer,
                            IceTSizeType inSparseImageBufferSize,
                            IceTSparseImage outSparseImage)
{
    IceTSparseImage inSparseImage;
    IceTVoid *package_buffer;
    IceTSizeType package_size;

    if (my_info->tile_sending != -1) {
        icetRaiseDebug2("Sending tile %d to node %d.", my_info->tile_sending,
                        my_info->send_dest);
        if (tile_held == my_info->tile_sending) {
            icetCompressImage(image, outSparseImage);
            tile_held = -1;
        } else {
            icetGetCompressedTileImage(my_info->tile_sending,
                                       outSparseImage);
        }
        icetSparseImagePackageForSend(outSparseImage,
                                      &package_buffer, &package_size);
    }

    if (my_info->tile_receiving != -1) {
        icetRaiseDebug2("Receiving tile %d from node %d.",
                        my_info->tile_receiving, my_info->recv_src);
        if (   (tile_held != my_info->tile_receiving)
            && all_contained_tmasks[my_info->rank*num_tiles
                                   +my_info->tile_receiving])
        {
            icetGetTileImage(my_info->tile_receiving, image);
            tile_held = my_info->tile_receiving;
        }

        if (my_info->tile_sending != -1) {
            icetCommSendrecv(package_buffer, package_size, ICET_BYTE,
                             my_info->send_dest, VTREE_IMAGE_DATA,
                             inSparseImageBuffer, inSparseImageBufferSize,
                             ICET_BYTE, my_info->recv_src, VTREE_IMAGE_DATA);
        } else {
            icetCommRecv(inSparseImageBuffer, inSparseImageBufferSize,
                         ICET_BYTE, my_info->recv_src, VTREE_IMAGE_DATA);
        }
        inSparseImage =icetSparseImageUnpackageFromReceive(inSparseImageBuffer);

        if (tile_held == my_info->tile_receiving) {
            icetCompressedComposite(image, inSparseImage, 1);
        } else {
            icetDecompressImage(inSparseImage, image);
        }

    } else if (my_info->tile_sending != -1) {
        icetCommSend(package_buffer, package_size, ICET_BYTE,
                     my_info->send_dest, VTREE_IMAGE_DATA);
    }
}